

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_concat(lua_State *L,int n)

{
  StkId pTVar1;
  TString *pTVar2;
  
  if (n < 2) {
    if (n == 0) {
      pTVar1 = L->top;
      pTVar2 = luaS_newlstr(L,"",0);
      (pTVar1->value_).gc = (GCObject *)pTVar2;
      pTVar1->tt_ = pTVar2->tt | 0x40;
      L->top = L->top + 1;
    }
  }
  else {
    luaV_concat(L,n);
  }
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
    return;
  }
  return;
}

Assistant:

LUA_API void lua_concat (lua_State *L, int n) {
  lua_lock(L);
  api_checknelems(L, n);
  if (n >= 2) {
    luaV_concat(L, n);
  }
  else if (n == 0) {  /* push empty string */
    setsvalue2s(L, L->top, luaS_newlstr(L, "", 0));
    api_incr_top(L);
  }
  /* else n == 1; nothing to do */
  luaC_checkGC(L);
  lua_unlock(L);
}